

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_handler.hpp
# Opt level: O0

void get_files(string *source_dir,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *image_path)

{
  bool bVar1;
  path *this;
  long lVar2;
  iterator __first;
  iterator __last;
  ostream *this_00;
  undefined1 local_e8 [8];
  string img_p;
  directory_entry *entry;
  undefined1 local_b0 [8];
  directory_iterator __end1;
  undefined1 local_90 [8];
  directory_iterator __begin1;
  path local_70;
  directory_iterator local_30;
  directory_iterator *local_20;
  directory_iterator *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *image_path_local;
  string *source_dir_local;
  
  __range1 = (directory_iterator *)image_path;
  image_path_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)source_dir;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_70,source_dir);
  CLI::std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            (&local_30,&local_70);
  CLI::std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
  local_20 = &local_30;
  CLI::std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)
             &__end1._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,local_20);
  CLI::std::experimental::filesystem::v1::__cxx11::begin
            ((__cxx11 *)local_90,
             (directory_iterator *)
             &__end1._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  CLI::std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)
             &__end1._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  CLI::std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&entry,local_20);
  CLI::std::experimental::filesystem::v1::__cxx11::end((directory_iterator *)local_b0);
  CLI::std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&entry);
  do {
    bVar1 = CLI::std::experimental::filesystem::v1::__cxx11::operator!=
                      ((directory_iterator *)local_90,(directory_iterator *)local_b0);
    if (!bVar1) {
      CLI::std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)local_b0);
      CLI::std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)local_90);
      CLI::std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
                (&local_30);
      __first = CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)__range1);
      __last = CLI::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__range1);
      std::
      sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,bool(*)(std::__cxx11::string,std::__cxx11::string)>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current,comp);
      this_00 = std::operator<<((ostream *)&std::cout,"done");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      return;
    }
    img_p.field_2._8_8_ =
         std::experimental::filesystem::v1::__cxx11::directory_iterator::operator*
                   ((directory_iterator *)local_90);
    this = CLI::std::experimental::filesystem::v1::__cxx11::directory_entry::path
                     ((directory_entry *)img_p.field_2._8_8_);
    std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
              ((string_type *)local_e8,this);
    lVar2 = std::__cxx11::string::find(local_e8,0x16a383);
    if (lVar2 == -1) {
      lVar2 = std::__cxx11::string::find(local_e8,0x16a388);
      if (lVar2 != -1) goto LAB_0010d3b9;
      lVar2 = std::__cxx11::string::find(local_e8,0x16a38e);
      if (lVar2 != -1) goto LAB_0010d3b9;
    }
    else {
LAB_0010d3b9:
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__range1,(value_type *)local_e8);
    }
    std::__cxx11::string::~string((string *)local_e8);
    std::experimental::filesystem::v1::__cxx11::directory_iterator::operator++
              ((directory_iterator *)local_90);
  } while( true );
}

Assistant:

void get_files(string source_dir, vector<string> &image_path)
{

    
    for (const auto &entry : experimental::filesystem::directory_iterator(source_dir))
    {
        string img_p = entry.path();
        if ((img_p.find(".jpg") != std::string::npos) or (img_p.find(".jpeg") != std::string::npos) or (img_p.find(".png") != std::string::npos))
        {
            image_path.push_back(img_p);
        }
    }
    sort(image_path.begin(), image_path.end(), comp);
    cout << "done"<<endl;
}